

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool __thiscall
MeCab::DecoderFeatureIndex::buildFeature(DecoderFeatureIndex *this,LearnerPath *path)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  long *in_RSI;
  string rfeature2;
  string lfeature2;
  string ufeature2;
  string rfeature1;
  string lfeature1;
  string ufeature1;
  die local_132;
  allocator local_131;
  string local_130 [34];
  byte local_10e;
  die local_10d [20];
  allocator local_f9;
  string local_f8 [16];
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  DictionaryRewriter *in_stack_ffffffffffffff38;
  FeatureIndex *in_stack_ffffffffffffff40;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [16];
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  LearnerPath *in_stack_ffffffffffffffc8;
  FeatureIndex *in_stack_ffffffffffffffd0;
  bool local_1;
  
  in_RSI[4] = 0;
  *(undefined8 *)(*in_RSI + 0x78) = 0;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::string(local_b8);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff28);
  pcVar1 = *(char **)(in_RSI[2] + 0x40);
  std::allocator<char>::allocator();
  local_10e = 0;
  std::__cxx11::string::string(local_f8,pcVar1,&local_f9);
  bVar2 = DictionaryRewriter::rewrite2
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                     in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (!bVar2) {
    die::die(local_10d);
    local_10e = 1;
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xef);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,
                             "rewrite_.rewrite2(path->lnode->feature, &ufeature1, &lfeature1, &rfeature1)"
                            );
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3," cannot rewrite pattern: ");
    poVar3 = std::operator<<(poVar3,*(char **)(in_RSI[2] + 0x40));
    die::operator&(local_10d,poVar3);
  }
  if ((local_10e & 1) != 0) {
    die::~die((die *)0x1106b9);
  }
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  pcVar1 = *(char **)(*in_RSI + 0x40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,pcVar1,&local_131);
  bVar2 = DictionaryRewriter::rewrite2
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                     in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (!bVar2) {
    die::die(&local_132);
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf6);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,
                             "rewrite_.rewrite2(path->rnode->feature, &ufeature2, &lfeature2, &rfeature2)"
                            );
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3," cannot rewrite pattern: ");
    poVar3 = std::operator<<(poVar3,*(char **)(*in_RSI + 0x40));
    die::operator&(&local_132,poVar3);
    die::~die((die *)0x110880);
  }
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::c_str();
  bVar2 = FeatureIndex::buildUnigramFeature
                    (in_stack_ffffffffffffff40,(LearnerPath *)in_stack_ffffffffffffff38,
                     (char *)in_stack_ffffffffffffff30);
  if (bVar2) {
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    bVar2 = FeatureIndex::buildBigramFeature
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
                       ,in_stack_ffffffffffffffb8);
    if (bVar2) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return local_1;
}

Assistant:

bool DecoderFeatureIndex::buildFeature(LearnerPath *path) {
  path->rnode->wcost = path->cost = 0.0;

  std::string ufeature1;
  std::string lfeature1;
  std::string rfeature1;
  std::string ufeature2;
  std::string lfeature2;
  std::string rfeature2;

  CHECK_DIE(rewrite_.rewrite2(path->lnode->feature,
                              &ufeature1,
                              &lfeature1,
                              &rfeature1))
      << " cannot rewrite pattern: "
      << path->lnode->feature;

  CHECK_DIE(rewrite_.rewrite2(path->rnode->feature,
                              &ufeature2,
                              &lfeature2,
                              &rfeature2))
      << " cannot rewrite pattern: "
      << path->rnode->feature;

  if (!buildUnigramFeature(path, ufeature2.c_str())) {
    return false;
  }

  if (!buildBigramFeature(path, rfeature1.c_str(), lfeature2.c_str())) {
    return false;
  }

  return true;
}